

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

string * __thiscall
pfederc::StringToken::toString_abi_cxx11_
          (string *__return_storage_ptr__,StringToken *this,Lexer *lexer)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->str);
  return __return_storage_ptr__;
}

Assistant:

std::string StringToken::toString(const Lexer &lexer) const noexcept {
  return str;
}